

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

bool check_single(char *chesses,int row,int col,int diff_row,int diff_col)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  bool bVar8;
  
  lVar4 = (long)diff_row;
  uVar5 = (col + -0x10) - diff_col;
  pcVar7 = chesses + (long)row * 0xf + lVar4 * -0xf;
  uVar1 = (row - diff_row) - 0x10;
  iVar2 = 1;
  lVar6 = 3;
  do {
    bVar3 = 1;
    if (0xfffffff0 < uVar5 && 0xfffffff0 < uVar1) {
      if ((chesses[col + -0x10 + row * 0xf] == '\0') || (pcVar7[(int)uVar5] == 0)) {
        bVar8 = false;
      }
      else {
        bVar8 = (int)chesses[col + -0x10 + row * 0xf] % 2 == (int)pcVar7[(int)uVar5] % 2;
      }
      iVar2 = iVar2 + (uint)bVar8;
      bVar3 = bVar8 ^ 1;
    }
    bVar8 = lVar6 != 0;
    lVar6 = lVar6 + -1;
    if (bVar3 != 0) break;
    uVar5 = uVar5 - diff_col;
    pcVar7 = pcVar7 + lVar4 * -0xf;
    uVar1 = uVar1 - diff_row;
  } while (bVar8);
  uVar5 = (diff_col + row) - 0x10;
  pcVar7 = chesses + (lVar4 + row) * 0xf;
  uVar1 = (diff_row + row) - 0x10;
  lVar6 = 3;
  do {
    bVar3 = 1;
    if (0xfffffff0 < uVar5 && 0xfffffff0 < uVar1) {
      if ((chesses[col + row * 0xf + -0x10] == '\0') || (pcVar7[(int)uVar5] == '\0')) {
        bVar8 = false;
      }
      else {
        bVar8 = (int)chesses[col + row * 0xf + -0x10] % 2 == (int)pcVar7[(int)uVar5] % 2;
      }
      iVar2 = iVar2 + (uint)bVar8;
      bVar3 = bVar8 ^ 1;
    }
    bVar8 = lVar6 != 0;
    lVar6 = lVar6 + -1;
    if (bVar3 != 0) break;
    uVar5 = uVar5 + diff_col;
    pcVar7 = pcVar7 + lVar4 * 0xf;
    uVar1 = uVar1 + diff_row;
  } while (bVar8);
  return 4 < iVar2;
}

Assistant:

bool check_single(char chesses[], int row, int col, int diff_row, int diff_col) {
    int link_num = 1;
    for (int i = 1; i < 5; i++) {
        int tmp_row = row - diff_row * i;
        int tmp_col = col - diff_col * i;
        if (tmp_row <= 0 || tmp_row > 15 || tmp_col <= 0 || tmp_col > 15) {
            break;
        }
        if (!check_color(chesses, row, col, tmp_row, tmp_col)) {
            break; 
        }
        link_num += 1;
    }

    for (int i = 1; i < 5; i++) {
        int tmp_row = row + diff_row * i;
        int tmp_col = row + diff_col * i;
        if (tmp_row <= 0 || tmp_row > 15 || tmp_col <= 0 || tmp_col > 15) {
            break;
        }
        if (!check_color(chesses, row, col, tmp_row, tmp_col)) {
            break;
        }
        link_num += 1;
    }
    return link_num >= 5;
}